

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O3

void evthread_debug_lock_mark_unlocked(uint mode,debug_lock *lock)

{
  int iVar1;
  unsigned_long uVar2;
  
  if (lock->signature == 0xdeb0b10c) {
    if ((lock->locktype & 2) == 0) {
      if ((mode & 0xc) != 0) {
        evthread_debug_lock_mark_unlocked_cold_3();
        goto LAB_00230801;
      }
    }
    else {
LAB_00230801:
      if ((mode & 0xc) == 0) goto LAB_00230852;
    }
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
      iVar1 = lock->count;
LAB_00230837:
      lock->count = iVar1 + -1;
      if (0 < iVar1) {
        return;
      }
      goto LAB_00230848;
    }
    uVar2 = (*evthread_id_fn_)();
    if (lock->held_by == uVar2) {
      iVar1 = lock->count;
      if (iVar1 == 1) {
        lock->held_by = 0;
        lock->count = 0;
        return;
      }
      goto LAB_00230837;
    }
  }
  else {
    evthread_debug_lock_mark_unlocked_cold_1();
LAB_00230848:
    evthread_debug_lock_mark_unlocked_cold_5();
  }
  evthread_debug_lock_mark_unlocked_cold_4();
LAB_00230852:
  evthread_debug_lock_mark_unlocked_cold_2();
}

Assistant:

static void
evthread_debug_lock_mark_unlocked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		EVUTIL_ASSERT(lock->held_by == me);
		if (lock->count == 1)
			lock->held_by = 0;
	}
	--lock->count;
	EVUTIL_ASSERT(lock->count >= 0);
}